

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O0

int set_search_internal(ps_decoder_t *ps,ps_search_t *search)

{
  ps_search_t *ppVar1;
  ps_search_t *old_search;
  ps_search_t *search_local;
  ps_decoder_t *ps_local;
  
  if (search == (ps_search_t *)0x0) {
    ps_local._4_4_ = -1;
  }
  else {
    search->pls = ps->phone_loop;
    ppVar1 = (ps_search_t *)hash_table_replace(ps->searches,search->name,search);
    if (ppVar1 != search) {
      (*ppVar1->vt->free)(ppVar1);
    }
    ps_local._4_4_ = 0;
  }
  return ps_local._4_4_;
}

Assistant:

static int
set_search_internal(ps_decoder_t *ps, ps_search_t *search)
{
    ps_search_t *old_search;
    
    if (!search)
	return -1;

    search->pls = ps->phone_loop;
    old_search = (ps_search_t *) hash_table_replace(ps->searches, ps_search_name(search), search);
    if (old_search != search)
        ps_search_free(old_search);

    return 0;
}